

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cases.cpp
# Opt level: O3

Clause * __thiscall
Inferences::Cases::performParamodulation(Cases *this,Clause *premise,Literal *lit,TermList t)

{
  TermList arg2;
  Self SVar1;
  int iVar2;
  ulong uVar3;
  Literal *pLVar4;
  Literal **ppLVar5;
  TermList sort;
  Clause *pCVar6;
  uint uVar7;
  long lVar8;
  RStack<Literal_*> resLits;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_80;
  GeneratingInference1 local_70;
  Inference local_60;
  
  uVar3 = (ulong)(*(uint *)&(lit->super_Term).field_0xc & 0xfffffff);
  pCVar6 = (Clause *)0x0;
  if (((lit->super_Term)._args[uVar3]._content != t._content) &&
     ((lit->super_Term)._args[uVar3 - 1]._content != t._content)) {
    if (performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)::troo == '\0') {
      iVar2 = __cxa_guard_acquire(&performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)
                                   ::troo);
      if (iVar2 != 0) {
        performParamodulation::troo._content = (uint64_t)Kernel::Term::foolTrue();
        __cxa_guard_release(&performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)
                             ::troo);
      }
    }
    if (performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)::fols == '\0') {
      iVar2 = __cxa_guard_acquire(&performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)
                                   ::fols);
      if (iVar2 != 0) {
        performParamodulation::fols._content = (uint64_t)Kernel::Term::foolFalse();
        __cxa_guard_release(&performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)
                             ::fols);
      }
    }
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    Recycled(&local_80);
    uVar7 = *(uint *)&premise->field_0x38 & 0xfffff;
    if (uVar7 != 0) {
      lVar8 = 0;
      do {
        SVar1._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                )local_80._self;
        pLVar4 = premise->_literals[lVar8];
        if (pLVar4 == lit) {
          pLVar4 = Kernel::EqHelper::replace(pLVar4,t,performParamodulation::troo);
        }
        ppLVar5 = *(Literal ***)
                   ((long)SVar1._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl + 0x10);
        if (ppLVar5 ==
            *(Literal ***)
             ((long)SVar1._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
             0x18)) {
          Lib::Stack<Kernel::Literal_*>::expand
                    ((Stack<Kernel::Literal_*> *)
                     SVar1._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
          ppLVar5 = *(Literal ***)
                     ((long)SVar1._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                            _M_head_impl + 0x10);
        }
        *ppLVar5 = pLVar4;
        *(Literal ***)
         ((long)SVar1._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10)
             = *(Literal ***)
                ((long)SVar1._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
                0x10) + 1;
        lVar8 = lVar8 + 1;
      } while ((uint)lVar8 < uVar7);
    }
    SVar1._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
         local_80._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
         .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
    arg2._content = performParamodulation::fols._content;
    sort = Kernel::AtomicSort::boolSort();
    pLVar4 = Kernel::Literal::createEquality(true,t,arg2,sort);
    ppLVar5 = *(Literal ***)
               ((long)SVar1._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
               0x10);
    if (ppLVar5 ==
        *(Literal ***)
         ((long)SVar1._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x18))
    {
      Lib::Stack<Kernel::Literal_*>::expand
                ((Stack<Kernel::Literal_*> *)
                 SVar1._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
      ppLVar5 = *(Literal ***)
                 ((long)SVar1._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                 + 0x10);
    }
    *ppLVar5 = pLVar4;
    *(Literal ***)
     ((long)SVar1._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10) =
         *(Literal ***)
          ((long)SVar1._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10)
         + 1;
    local_70.rule = FOOL_PARAMODULATION;
    local_70.premise = premise;
    Kernel::Inference::Inference(&local_60,&local_70);
    pCVar6 = Kernel::Clause::fromStack
                       ((Stack<Kernel::Literal_*> *)
                        local_80._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                        &local_60);
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    ~Recycled(&local_80);
  }
  return pCVar6;
}

Assistant:

Clause* Cases::performParamodulation(Clause* premise, Literal* lit, TermList t) {
  ASS(t.isTerm());

  TermList lhs = *lit->nthArgument(0);
  TermList rhs = *lit->nthArgument(1);

  if((t == lhs) || (t == rhs)){
    return 0;
  }

  static TermList troo(Term::foolTrue());
  static TermList fols(Term::foolFalse());


  // Found a boolean term! Create the C[true] \/ s = false clause

  RStack<Literal*> resLits;

  // Copy the literals from the premise except for the one at `literalPosition`,
  // that has the occurrence of `booleanTerm` replaced with false
  for (Literal* curr : iterTraits(premise->iterLits())) {
    resLits->push( curr != lit 
        ? curr
        : EqHelper::replace(curr, t, troo));
  }

  // Add s = false to the clause
  resLits->push(Literal::createEquality(true, t, fols, AtomicSort::boolSort()));

  return Clause::fromStack(*resLits, GeneratingInference1(InferenceRule::FOOL_PARAMODULATION, premise));
}